

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::TrySetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,TextureMap *textures,string *propName,
          aiTextureType target,MeshGeometry *mesh)

{
  float *__return_storage_ptr__;
  Texture *tex_00;
  Geometry *pGVar1;
  bool bVar2;
  __type _Var3;
  reference ppVar4;
  aiVector2D *paVar5;
  PropertyTable *this_00;
  long lVar6;
  iterator __first;
  iterator __first_00;
  iterator __last;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
  __last_00;
  difference_type dVar7;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar8;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *this_01;
  undefined1 useTemplate;
  MeshGeometry *local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  format local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  format local_a98;
  string local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_900;
  string *name_1;
  uint i_1;
  int index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  format local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  format local_6f8;
  int local_57c;
  string local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_558;
  string *name;
  uint i;
  int index;
  int *local_540;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_538;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_530;
  vector<int,_std::allocator<int>_> *local_528;
  MatIndexArray *mats;
  MeshGeometry *meshGeom;
  value_type *v;
  iterator __end6;
  iterator __begin6;
  MeshMap *__range6;
  uint local_4d8 [2];
  uint matIndex;
  allocator local_4c1;
  undefined1 local_4c0 [32];
  _Rb_tree_node_base local_4a0;
  _Base_ptr local_480;
  string *uvSet;
  bool ok;
  PropertyTable *pPStack_470;
  int uvIndex;
  PropertyTable *props;
  aiUVTransform uvTrafo;
  aiString path;
  Texture *tex;
  _Self local_40;
  const_iterator it;
  MeshGeometry *mesh_local;
  aiTextureType target_local;
  string *propName_local;
  TextureMap *textures_local;
  aiMaterial *out_mat_local;
  FBXConverter *this_local;
  
  it._M_node = (_Base_ptr)mesh;
  textures_local = (TextureMap *)out_mat;
  out_mat_local = (aiMaterial *)this;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
       ::find(textures,propName);
  tex = (Texture *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
        ::end(textures);
  bVar2 = std::operator==(&local_40,(_Self *)&tex);
  if (!bVar2) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>
             ::operator*(&local_40);
    tex_00 = ppVar4->second;
    if (tex_00 != (Texture *)0x0) {
      __return_storage_ptr__ = &uvTrafo.mScaling.y;
      GetTexturePath((aiString *)__return_storage_ptr__,this,tex_00);
      aiMaterial::AddProperty
                ((aiMaterial *)textures_local,(aiString *)__return_storage_ptr__,"$tex.file",target,
                 0);
      aiUVTransform::aiUVTransform((aiUVTransform *)&props);
      paVar5 = Texture::UVScaling(tex_00);
      uvTrafo.mTranslation = *paVar5;
      paVar5 = Texture::UVTranslation(tex_00);
      useTemplate = 0;
      props = *(PropertyTable **)paVar5;
      aiMaterial::AddProperty
                ((aiMaterial *)textures_local,(aiUVTransform *)&props,1,"$tex.uvtrafo",target,0);
      this_00 = Texture::Props(tex_00);
      uvSet._4_4_ = 0;
      pPStack_470 = this_00;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_4c0,"UVSet",&local_4c1);
      PropertyGet<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_4c0 + 0x20),(FBX *)this_00,(PropertyTable *)local_4c0,
                 (string *)((long)&uvSet + 3),(bool *)0x0,(bool)useTemplate);
      std::__cxx11::string::~string((string *)local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
      local_480 = (_Base_ptr)(local_4c0 + 0x20);
      if ((((uvSet._3_1_ & 1) != 0) &&
          (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_480,"default"), bVar2)) &&
         (lVar6 = std::__cxx11::string::length(), lVar6 != 0)) {
        this_01 = &this->materials;
        __first = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(this_01);
        __first_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(this_01);
        __last = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(this_01);
        __last_00 = std::
                    find<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial*>
                              (__first_00._M_current,__last._M_current,
                               (aiMaterial **)&textures_local);
        dVar7 = std::
                distance<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>>
                          ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                            )__first._M_current,__last_00);
        local_4d8[0] = (uint)dVar7;
        uvSet._4_4_ = 0xffffffff;
        if (it._M_node == (_Base_ptr)0x0) {
          __end6 = std::
                   map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   ::begin(&this->meshes_converted);
          v = (value_type *)
              std::
              map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::end(&this->meshes_converted);
          while (bVar2 = std::operator!=(&__end6,(_Self *)&v), bVar2) {
            meshGeom = (MeshGeometry *)
                       std::
                       _Rb_tree_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ::operator*(&__end6);
            pGVar1 = (Geometry *)(meshGeom->super_Geometry).super_Object._vptr_Object;
            if (pGVar1 == (Geometry *)0x0) {
              local_cf0 = (MeshGeometry *)0x0;
            }
            else {
              local_cf0 = (MeshGeometry *)
                          __dynamic_cast(pGVar1,&Geometry::typeinfo,&MeshGeometry::typeinfo,0);
            }
            mats = (MatIndexArray *)local_cf0;
            if (local_cf0 != (MeshGeometry *)0x0) {
              local_528 = MeshGeometry::GetMaterialIndices(local_cf0);
              local_538._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(local_528)
              ;
              local_540 = (int *)std::vector<int,_std::allocator<int>_>::end(local_528);
              local_530 = std::
                          find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,unsigned_int>
                                    (local_538,
                                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                      )local_540,local_4d8);
              _i = std::vector<int,_std::allocator<int>_>::end(local_528);
              bVar2 = __gnu_cxx::operator==
                                (&local_530,
                                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&i);
              if (!bVar2) {
                name._4_4_ = 0xffffffff;
                for (name._0_4_ = 0; (uint)name < 8; name._0_4_ = (uint)name + 1) {
                  pvVar8 = MeshGeometry::GetTextureCoords((MeshGeometry *)mats,(uint)name);
                  bVar2 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::empty
                                    (pvVar8);
                  if (bVar2) break;
                  MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                            (&local_578,(MeshGeometry *)mats,(uint)name);
                  local_558 = &local_578;
                  _Var3 = std::operator==(local_558,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_480);
                  if (_Var3) {
                    name._4_4_ = (uint)name;
                    local_57c = 4;
                  }
                  else {
                    local_57c = 0;
                  }
                  std::__cxx11::string::~string((string *)&local_578);
                  if (local_57c != 0) break;
                }
                if (name._4_4_ == 0xffffffff) {
                  std::operator+(&local_738,"did not find UV channel named ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_480);
                  std::operator+(&local_718,&local_738," in a mesh using this material");
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  basic_formatter<std::__cxx11::string>
                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_6f8,&local_718);
                  LogFunctions<Assimp::FBXImporter>::LogWarn(&local_6f8);
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  ~basic_formatter(&local_6f8);
                  std::__cxx11::string::~string((string *)&local_718);
                  std::__cxx11::string::~string((string *)&local_738);
                }
                else if (uvSet._4_4_ == 0xffffffff) {
                  uvSet._4_4_ = name._4_4_;
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i_1,"the UV channel named ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_480);
                  std::operator+(&local_8d0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i_1,
                                 " appears at different positions in meshes, results will be wrong")
                  ;
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  basic_formatter<std::__cxx11::string>
                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_8b0,&local_8d0);
                  LogFunctions<Assimp::FBXImporter>::LogWarn(&local_8b0);
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  ~basic_formatter(&local_8b0);
                  std::__cxx11::string::~string((string *)&local_8d0);
                  std::__cxx11::string::~string((string *)&i_1);
                }
              }
            }
            std::
            _Rb_tree_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator++(&__end6);
          }
        }
        else {
          name_1._4_4_ = 0xffffffff;
          for (name_1._0_4_ = 0; (uint)name_1 < 8; name_1._0_4_ = (uint)name_1 + 1) {
            pvVar8 = MeshGeometry::GetTextureCoords((MeshGeometry *)it._M_node,(uint)name_1);
            bVar2 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::empty
                              (pvVar8);
            if (bVar2) break;
            MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                      (&local_920,(MeshGeometry *)it._M_node,(uint)name_1);
            local_900 = &local_920;
            _Var3 = std::operator==(local_900,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_480);
            if (_Var3) {
              name_1._4_4_ = (uint)name_1;
              local_57c = 7;
            }
            else {
              local_57c = 0;
            }
            std::__cxx11::string::~string((string *)&local_920);
            if (local_57c != 0) break;
          }
          if (name_1._4_4_ == 0xffffffff) {
            std::operator+(&local_ad8,"did not find UV channel named ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_480);
            std::operator+(&local_ab8,&local_ad8," in a mesh using this material");
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_a98,&local_ab8);
            LogFunctions<Assimp::FBXImporter>::LogWarn(&local_a98);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter(&local_a98);
            std::__cxx11::string::~string((string *)&local_ab8);
            std::__cxx11::string::~string((string *)&local_ad8);
          }
          if (uvSet._4_4_ == 0xffffffff) {
            uvSet._4_4_ = name_1._4_4_;
          }
        }
        if (uvSet._4_4_ == 0xffffffff) {
          std::operator+(&local_c90,"failed to resolve UV channel ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_480);
          std::operator+(&local_c70,&local_c90,", using first UV channel");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_c50
                     ,&local_c70);
          LogFunctions<Assimp::FBXImporter>::LogWarn(&local_c50);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_c50);
          std::__cxx11::string::~string((string *)&local_c70);
          std::__cxx11::string::~string((string *)&local_c90);
          uvSet._4_4_ = 0;
        }
      }
      aiMaterial::AddProperty
                ((aiMaterial *)textures_local,(int *)((long)&uvSet + 4),1,"$tex.uvwsrc",target,0);
      std::__cxx11::string::~string((string *)(local_4c0 + 0x20));
    }
  }
  return;
}

Assistant:

void FBXConverter::TrySetTextureProperties(aiMaterial* out_mat, const TextureMap& textures,
                const std::string& propName,
                aiTextureType target, const MeshGeometry* const mesh) {
            TextureMap::const_iterator it = textures.find(propName);
            if (it == textures.end()) {
                return;
            }

            const Texture* const tex = (*it).second;
            if (tex != 0)
            {
                aiString path = GetTexturePath(tex);
                out_mat->AddProperty(&path, _AI_MATKEY_TEXTURE_BASE, target, 0);

                aiUVTransform uvTrafo;
                // XXX handle all kinds of UV transformations
                uvTrafo.mScaling = tex->UVScaling();
                uvTrafo.mTranslation = tex->UVTranslation();
                out_mat->AddProperty(&uvTrafo, 1, _AI_MATKEY_UVTRANSFORM_BASE, target, 0);

                const PropertyTable& props = tex->Props();

                int uvIndex = 0;

                bool ok;
                const std::string& uvSet = PropertyGet<std::string>(props, "UVSet", ok);
                if (ok) {
                    // "default" is the name which usually appears in the FbxFileTexture template
                    if (uvSet != "default" && uvSet.length()) {
                        // this is a bit awkward - we need to find a mesh that uses this
                        // material and scan its UV channels for the given UV name because
                        // assimp references UV channels by index, not by name.

                        // XXX: the case that UV channels may appear in different orders
                        // in meshes is unhandled. A possible solution would be to sort
                        // the UV channels alphabetically, but this would have the side
                        // effect that the primary (first) UV channel would sometimes
                        // be moved, causing trouble when users read only the first
                        // UV channel and ignore UV channel assignments altogether.

                        const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(),
                            std::find(materials.begin(), materials.end(), out_mat)
                        ));


                        uvIndex = -1;
                        if (!mesh)
                        {
                            for (const MeshMap::value_type& v : meshes_converted) {
                                const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*> (v.first);
                                if (!meshGeom) {
                                    continue;
                                }

                                const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                                if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                    continue;
                                }

                                int index = -1;
                                for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                    if (meshGeom->GetTextureCoords(i).empty()) {
                                        break;
                                    }
                                    const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                    if (name == uvSet) {
                                        index = static_cast<int>(i);
                                        break;
                                    }
                                }
                                if (index == -1) {
                                    FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                    continue;
                                }

                                if (uvIndex == -1) {
                                    uvIndex = index;
                                }
                                else {
                                    FBXImporter::LogWarn("the UV channel named " + uvSet +
                                        " appears at different positions in meshes, results will be wrong");
                                }
                            }
                        }
                        else
                        {
                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (mesh->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = mesh->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                        }

                        if (uvIndex == -1) {
                            FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                            uvIndex = 0;
                        }
                    }
                }

                out_mat->AddProperty(&uvIndex, 1, _AI_MATKEY_UVWSRC_BASE, target, 0);
            }
        }